

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O2

void cmEraseIf<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,(anonymous_namespace)::file_not_persistent>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *cont,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  const_iterator __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  this = (cont->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (cont->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pbVar1 - (long)this;
  for (lVar3 = lVar5 >> 7; pbVar4 = this, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                      ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)this,param_2);
    if (bVar2) goto LAB_003b8f79;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                      ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)(this + 1),param_2)
    ;
    pbVar4 = this + 1;
    if (bVar2) goto LAB_003b8f79;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                      ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)(this + 2),param_2)
    ;
    pbVar4 = this + 2;
    if (bVar2) goto LAB_003b8f79;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                      ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)(this + 3),param_2)
    ;
    pbVar4 = this + 3;
    if (bVar2) goto LAB_003b8f79;
    this = this + 4;
    lVar5 = lVar5 + -0x80;
  }
  lVar5 = lVar5 >> 5;
  if (lVar5 == 1) {
LAB_003b8f68:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                      ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)this,param_2);
    pbVar4 = this;
    if (!bVar2) {
      pbVar4 = pbVar1;
    }
  }
  else if (lVar5 == 2) {
LAB_003b8f58:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                      ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)this,param_2);
    pbVar4 = this;
    if (!bVar2) {
      this = this + 1;
      goto LAB_003b8f68;
    }
  }
  else {
    __first._M_current = pbVar1;
    if (lVar5 != 3) goto LAB_003b8faf;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                      ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)this,param_2);
    if (!bVar2) {
      this = this + 1;
      goto LAB_003b8f58;
    }
  }
LAB_003b8f79:
  __first._M_current = pbVar4;
  if (pbVar4 != pbVar1) {
    while (pbVar4 = pbVar4 + 1, pbVar4 != pbVar1) {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<(anonymous_namespace)::file_not_persistent>::operator()
                        ((_Iter_pred<(anonymous_namespace)::file_not_persistent> *)pbVar4,param_2);
      if (!bVar2) {
        param_2._M_current = pbVar4;
        std::__cxx11::string::operator=((string *)__first._M_current,(string *)pbVar4);
        __first._M_current = __first._M_current + 1;
      }
    }
  }
LAB_003b8faf:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(cont,__first,
          (cont->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void cmEraseIf(Container& cont, Predicate pred)
{
  cont.erase(std::remove_if(cont.begin(), cont.end(), pred), cont.end());
}